

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O2

vector<duckdb::PivotColumn,_true> * __thiscall
duckdb::Transformer::TransformPivotList
          (vector<duckdb::PivotColumn,_true> *__return_storage_ptr__,Transformer *this,PGList *list,
          bool is_pivot)

{
  PGPivot *pivot_00;
  optional_ptr<duckdb_libpgquery::PGPivot,_true> pivot;
  optional_ptr<duckdb_libpgquery::PGPivot,_true> local_a8;
  PivotColumn local_a0;
  
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while (list = (PGList *)list->head, list != (PGList *)0x0) {
    local_a8.ptr = *(PGPivot **)list;
    pivot_00 = optional_ptr<duckdb_libpgquery::PGPivot,_true>::operator*(&local_a8);
    TransformPivotColumn(&local_a0,this,pivot_00,is_pivot);
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::
    emplace_back<duckdb::PivotColumn>
              (&__return_storage_ptr__->
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,&local_a0);
    PivotColumn::~PivotColumn(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PivotColumn> Transformer::TransformPivotList(duckdb_libpgquery::PGList &list, bool is_pivot) {
	vector<PivotColumn> result;
	for (auto node = list.head; node != nullptr; node = node->next) {
		auto pivot = PGPointerCast<duckdb_libpgquery::PGPivot>(node->data.ptr_value);
		result.push_back(TransformPivotColumn(*pivot, is_pivot));
	}
	return result;
}